

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void __thiscall
Js::JavascriptArray::InitBoxedInlineSegments<Js::JavascriptNativeIntArray>
          (JavascriptArray *this,JavascriptNativeIntArray *instance,bool deepCopy)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  InterruptPoller *pIVar4;
  SparseArraySegmentBase *pSVar5;
  code *pcVar6;
  bool bVar7;
  DynamicObjectFlags DVar8;
  undefined4 *puVar9;
  Recycler *pRVar10;
  SparseArraySegmentBase *pSVar11;
  Type *addr;
  Type TVar12;
  undefined1 local_68 [8];
  AutoDisableInterrupt failFastError;
  SparseArraySegmentBase *local_40;
  
  DVar8 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  DynamicObject::SetArrayFlags((DynamicObject *)this,DVar8 & ~HasSegmentMap);
  pSVar11 = (instance->super_JavascriptNativeArray).super_JavascriptArray.head.ptr;
  TVar12 = pSVar11->size;
  bVar7 = IsInlineSegment(pSVar11,(JavascriptArray *)instance);
  failFastError._8_8_ = this;
  if (bVar7) {
    local_40 = &DetermineInlineHeadSegmentPointer<Js::JavascriptNativeIntArray,0u,true>
                          ((JavascriptNativeIntArray *)this)->super_SparseArraySegmentBase;
    TVar12 = pSVar11->length;
    local_40->left = pSVar11->left;
    local_40->length = TVar12;
    TVar12 = 0x40;
    if (pSVar11->size < 0x40) {
      TVar12 = pSVar11->size;
    }
    local_40->size = TVar12;
  }
  else {
    pRVar10 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    uVar1 = pSVar11->left;
    uVar2 = pSVar11->length;
    uVar3 = pSVar11->size;
    pSVar5 = (pSVar11->next).ptr;
    bVar7 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayLeafSegmentPhase);
    if ((pSVar5 != (SparseArraySegmentBase *)0x0) || (bVar7)) {
      local_40 = &SparseArraySegment<int>::AllocateSegmentImpl<false>
                            (pRVar10,uVar1,uVar2,uVar3,pSVar5)->super_SparseArraySegmentBase;
      this = (JavascriptArray *)failFastError._8_8_;
    }
    else {
      local_40 = &SparseArraySegment<int>::AllocateSegmentImpl<true>
                            (pRVar10,uVar1,uVar2,uVar3,(SparseArraySegmentBase *)0x0)->
                  super_SparseArraySegmentBase;
      this = (JavascriptArray *)failFastError._8_8_;
    }
  }
  SetHeadAndLastUsedSegment(this,local_40);
  SparseArraySegmentBase::CheckLengthvsSize(local_40);
  bVar7 = IsInlineSegment(pSVar11,(JavascriptArray *)instance);
  if ((bVar7) && (bVar7 = IsInlineSegment(local_40,this), !bVar7)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2f06,
                                "(!IsInlineSegment(src, instance) || IsInlineSegment(dst, static_cast<T*>(this)))"
                                ,
                                "!IsInlineSegment(src, instance) || IsInlineSegment(dst, static_cast<T*>(this))"
                               );
    if (!bVar7) goto LAB_00b9dc43;
    *puVar9 = 0;
  }
  Memory::CopyArray<int,int,Memory::Recycler>
            ((int *)(local_40 + 1),(ulong)local_40->size,(int *)(pSVar11 + 1),(ulong)TVar12);
  if (deepCopy) {
    local_68 = (undefined1  [8])
               ((((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
               threadContext;
    failFastError.m_threadContext._0_2_ = 0;
    failFastError.m_threadContext._2_1_ = 1;
    pIVar4 = ((ThreadContext *)local_68)->interruptPoller;
    if (pIVar4 != (InterruptPoller *)0x0) {
      failFastError.m_threadContext._0_2_ = (ushort)pIVar4->isDisabled << 8;
      pIVar4->isDisabled = true;
    }
    while (pSVar5 = (pSVar11->next).ptr, pSVar5 != (SparseArraySegmentBase *)0x0) {
      pRVar10 = RecyclableObject::GetRecycler((RecyclableObject *)failFastError._8_8_);
      uVar1 = pSVar5->left;
      uVar2 = pSVar5->length;
      uVar3 = pSVar5->size;
      pSVar11 = (pSVar5->next).ptr;
      bVar7 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayLeafSegmentPhase);
      if (pSVar11 == (SparseArraySegmentBase *)0x0 && !bVar7) {
        pSVar11 = &SparseArraySegment<int>::AllocateSegmentImpl<true>
                             (pRVar10,uVar1,uVar2,uVar3,(SparseArraySegmentBase *)0x0)->
                   super_SparseArraySegmentBase;
      }
      else {
        pSVar11 = &SparseArraySegment<int>::AllocateSegmentImpl<false>
                             (pRVar10,uVar1,uVar2,uVar3,pSVar11)->super_SparseArraySegmentBase;
      }
      addr = &local_40->next;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = pSVar11;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      local_40 = addr->ptr;
      Memory::CopyArray<int,int,Memory::Recycler>
                ((int *)(local_40 + 1),(ulong)local_40->size,(int *)(pSVar5 + 1),(ulong)pSVar5->size
                );
      pSVar11 = pSVar5;
    }
    (local_40->next).ptr = (SparseArraySegmentBase *)0x0;
    failFastError.m_threadContext._0_1_ = 1;
    AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)local_68);
    this = (JavascriptArray *)failFastError._8_8_;
  }
  else {
    pSVar5 = (pSVar11->next).ptr;
    Memory::Recycler::WBSetBit((char *)&local_40->next);
    (local_40->next).ptr = pSVar5;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40->next);
  }
  pSVar5 = (((this->head).ptr)->next).ptr;
  if ((pSVar5 != (SparseArraySegmentBase *)0x0) && (deepCopy && pSVar5 == (pSVar11->next).ptr)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2f2f,
                                "(this->head->next == nullptr || this->head->next != src->next || !deepCopy)"
                                ,
                                "this->head->next == nullptr || this->head->next != src->next || !deepCopy"
                               );
    if (!bVar7) {
LAB_00b9dc43:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar9 = 0;
  }
  return;
}

Assistant:

void JavascriptArray::InitBoxedInlineSegments(T * instance, bool deepCopy)
    {
        // Don't copy the segment map, we will build it again
        SetFlags(GetFlags() & ~DynamicObjectFlags::HasSegmentMap);

        SparseArraySegment<typename T::TElement>* src = SparseArraySegment<typename T::TElement>::From(instance->head);
        SparseArraySegment<typename T::TElement>* dst;

        uint32 sourceSize = src->size;
        if (IsInlineSegment(src, instance))
        {
            // Copy head segment data between inlined head segments
            dst = DetermineInlineHeadSegmentPointer<T, 0, true>(static_cast<T*>(this));
            dst->left = src->left;
            dst->length = src->length;
            uint inlineChunkSize = SparseArraySegmentBase::INLINE_CHUNK_SIZE;
            dst->size = min(src->size, inlineChunkSize);
            sourceSize = dst->size;
        }
        else
        {
            // Otherwise, ensure that the new head segment is allocated now in the recycler so that the data can be copied.
            // Note: src->next is provided to control whether a leaf segment is allocated just as it is with instance. If
            //  src->next is non-null, the appropriate update to dst->next will continue below.
            dst = SparseArraySegment<typename T::TElement>::AllocateSegment(GetRecycler(), src->left, src->length, src->size, src->next);
        }

        SetHeadAndLastUsedSegment(dst);
        dst->CheckLengthvsSize();

        Assert(!IsInlineSegment(src, instance) || IsInlineSegment(dst, static_cast<T*>(this)));

        CopyArray(dst->elements, dst->size, src->elements, sourceSize);

        if (!deepCopy)
        {
            // Without a deep copy, point to the existing next segment from the original instance
            dst->next = src->next;
        }
        else
        {
            // When deepCopy is true, make a separate copy of each segment. While this involves data
            // duplication, it allows the new object to have a separate lifetime without sharing data.
            AutoDisableInterrupt failFastError(GetScriptContext()->GetThreadContext());
            do
            {
                if (src->next != nullptr)
                {
                    // Allocate a new segment in the destination and copy from src
                    // note: PointerValue is to strip SWB wrapping before static_cast
                    src = static_cast<SparseArraySegment<typename T::TElement>*>(PointerValue(src->next));

                    dst->next = dst->AllocateSegment(GetRecycler(), src->left, src->length, src->size, src->next);
                    dst = static_cast<SparseArraySegment<typename T::TElement>*>(PointerValue(dst->next));

                    CopyArray(dst->elements, dst->size, src->elements, src->size);
                }
                else
                {
                    // Terminate the loop
                    dst->next = nullptr;
                    dst = nullptr;
                }
            } while (dst != nullptr);
            failFastError.Completed();
        }

        // Assert either
        // - there is only the head segment
        // - the new head segment points to a new next segment
        // - the new head segment points to the existing next segment because this is not a deepCopy
        Assert(this->head->next == nullptr || this->head->next != src->next || !deepCopy);
    }